

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O2

MemoryProfiler * MemoryProfiler::EnsureMemoryProfiler(void)

{
  AutoPtr<MemoryProfiler,_Memory::NoCheckHeapAllocator> AVar1;
  long *plVar2;
  BasePtr<MemoryProfiler> this;
  AutoCriticalSection local_28;
  AutoCriticalSection autocs;
  
  plVar2 = (long *)__tls_get_addr(&PTR_013e5c50);
  this.ptr = (MemoryProfiler *)*plVar2;
  if (this.ptr == (MemoryProfiler *)0x0) {
    this.ptr = (MemoryProfiler *)
               Memory::NoCheckHeapAllocator::Alloc
                         ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x428);
    MemoryProfiler(this.ptr);
    local_28.cs = &s_cs;
    CCLock::Enter(&s_cs.super_CCLock);
    AVar1 = profilers;
    profilers.super_BasePtr<MemoryProfiler>.ptr = (BasePtr<MemoryProfiler>)(MemoryProfiler *)0x0;
    (this.ptr)->next = (MemoryProfiler *)AVar1.super_BasePtr<MemoryProfiler>.ptr;
    AutoPtr<MemoryProfiler,_Memory::NoCheckHeapAllocator>::Clear(&profilers);
    profilers.super_BasePtr<MemoryProfiler>.ptr =
         (BasePtr<MemoryProfiler>)(BasePtr<MemoryProfiler>)this.ptr;
    AutoCriticalSection::~AutoCriticalSection(&local_28);
    *plVar2 = (long)this.ptr;
  }
  return this.ptr;
}

Assistant:

MemoryProfiler *
MemoryProfiler::EnsureMemoryProfiler()
{
    MemoryProfiler * memoryProfiler = MemoryProfiler::Instance;

    if (memoryProfiler == nullptr)
    {
        memoryProfiler = NoCheckHeapNew(MemoryProfiler);

        {
            AutoCriticalSection autocs(&s_cs);
            memoryProfiler->next = MemoryProfiler::profilers.Detach();
            MemoryProfiler::profilers = memoryProfiler;
        }

        MemoryProfiler::Instance = memoryProfiler;
    }
    return memoryProfiler;
}